

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crossover.cc
# Opt level: O0

void __thiscall
ipx::Crossover::PushDual
          (Crossover *this,Basis *basis,Vector *y,Vector *z,
          vector<int,_std::allocator<int>_> *variables,Vector *x,Info *info)

{
  double dVar1;
  size_type sVar2;
  double *pdVar3;
  uint *puVar4;
  vector<int,_std::allocator<int>_> *in_RDX;
  Basis *in_RSI;
  valarray<double> *in_R9;
  size_t j;
  vector<int,_std::allocator<int>_> sign_restrict;
  Vector *ub;
  Vector *lb;
  Int n;
  Int m;
  Model *model;
  int *in_stack_00000378;
  vector<int,_std::allocator<int>_> *in_stack_00000380;
  Vector *in_stack_00000388;
  Vector *in_stack_00000390;
  Basis *in_stack_00000398;
  Crossover *in_stack_000003a0;
  Info *in_stack_000003b0;
  allocator_type *in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff20;
  ulong local_88;
  vector<int,_std::allocator<int>_> local_68;
  Vector *local_50;
  Vector *local_48;
  Int local_40;
  Int local_3c;
  Model *local_38;
  valarray<double> *local_30;
  vector<int,_std::allocator<int>_> *local_18;
  
  local_30 = in_R9;
  local_18 = in_RDX;
  local_38 = Basis::model(in_RSI);
  local_3c = Model::rows(local_38);
  local_40 = Model::cols(local_38);
  local_48 = Model::lb(local_38);
  local_50 = Model::ub(local_38);
  std::allocator<int>::allocator((allocator<int> *)0x81677c);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::allocator<int>::~allocator((allocator<int> *)0x8167a2);
  for (local_88 = 0; sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_68),
      local_88 < sVar2; local_88 = local_88 + 1) {
    pdVar3 = std::valarray<double>::operator[](local_30,local_88);
    dVar1 = *pdVar3;
    pdVar3 = std::valarray<double>::operator[](local_50,local_88);
    if ((dVar1 != *pdVar3) || (NAN(dVar1) || NAN(*pdVar3))) {
      puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&local_68,local_88);
      *puVar4 = *puVar4 | 1;
    }
    pdVar3 = std::valarray<double>::operator[](local_30,local_88);
    dVar1 = *pdVar3;
    pdVar3 = std::valarray<double>::operator[](local_48,local_88);
    if ((dVar1 != *pdVar3) || (NAN(dVar1) || NAN(*pdVar3))) {
      puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&local_68,local_88);
      *puVar4 = *puVar4 | 2;
    }
  }
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x816973);
  PushDual(in_stack_000003a0,in_stack_00000398,in_stack_00000390,in_stack_00000388,in_stack_00000380
           ,in_stack_00000378,in_stack_000003b0);
  std::vector<int,_std::allocator<int>_>::~vector(local_18);
  return;
}

Assistant:

void Crossover::PushDual(Basis* basis, Vector& y, Vector& z,
                         const std::vector<Int>& variables,
                         const Vector& x, Info* info) {
    const Model& model = basis->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();

    std::vector<int> sign_restrict(n+m);
    for (size_t j = 0; j < sign_restrict.size(); j++) {
        if (x[j] != ub[j]) sign_restrict[j] |= 1;
        if (x[j] != lb[j]) sign_restrict[j] |= 2;
    }
    PushDual(basis, y, z, variables, sign_restrict.data(), info);
}